

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O0

void aes_cmac_process_x86(aes_context *ctx,uint8_t *block,uint8_t *buffer,uint32_t size)

{
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qb;
  __m128i alVar1;
  __m128i input;
  uint local_9c;
  undefined8 uStack_98;
  uint32_t i;
  __m128i tmp;
  __m128i *data;
  __m128i *key;
  uint32_t size_local;
  uint8_t *buffer_local;
  uint8_t *block_local;
  aes_context *ctx_local;
  
  uStack_98 = *(undefined8 *)block;
  tmp[0] = *(longlong *)(block + 8);
  tmp[1] = (longlong)buffer;
  for (local_9c = 0; local_9c < size; local_9c = local_9c + 0x10) {
    tmp[1] = tmp[1] + 0x10;
    alVar1[1]._0_4_ = ctx->nr;
    alVar1[0] = (longlong)ctx->key;
    alVar1[1]._4_4_ = 0;
    alVar1 = aes_encrypt_x86(alVar1,(__m128i *)buffer,(int)tmp[1]);
    buffer = alVar1[1];
    uStack_98 = extraout_XMM0_Qa;
    tmp[0] = extraout_XMM0_Qb;
  }
  *(undefined8 *)block = uStack_98;
  *(longlong *)(block + 8) = tmp[0];
  return;
}

Assistant:

void aes_cmac_process_x86(const aes_context* ctx, uint8_t* block, const uint8_t* buffer, uint32_t size)
{
  const __m128i* key = (__m128i*)ctx->key;
  __m128i* data = (__m128i*)buffer;

  __m128i tmp = _mm_loadu_si128((__m128i*)block);
  for (uint32_t i = 0; i < size; i += 16)
  {
    __m128i input = _mm_loadu_si128(data++);
    tmp = _mm_xor_si128(tmp, input);
    tmp = aes_encrypt_x86(tmp, key, ctx->nr);
  }
  _mm_storeu_si128((__m128i*)block, tmp);
}